

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall CTape::CTape(CTape *this,int tape_lentgh)

{
  allocator_type aVar1;
  mapped_type *pmVar2;
  ostream *this_00;
  _Base_ptr p_Var3;
  double __x;
  allocator_type local_1e8 [8];
  stringstream ss;
  ostream local_1d8 [112];
  ios_base local_168 [264];
  undefined1 local_60;
  undefined7 uStack_5f;
  long local_50 [2];
  CTape *local_40;
  _Base_ptr local_38;
  
  std::vector<CNumber<27>,_std::allocator<CNumber<27>_>_>::vector
            (&this->m_tape,(long)tape_lentgh,local_1e8);
  (this->m_pos).m_number = 0;
  local_38 = &(this->m_l2t)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->m_l2t)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_l2t)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_l2t)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_38;
  (this->m_l2t)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_38;
  (this->m_l2t)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e8[0] = (allocator_type)0x20;
  pmVar2 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
           operator[](&this->m_l2t,(key_type *)local_1e8);
  *pmVar2 = 0;
  local_1e8[0] = (allocator_type)0x41;
  do {
    aVar1 = local_1e8[0];
    pmVar2 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](&this->m_l2t,(key_type *)local_1e8);
    *pmVar2 = (char)aVar1 + -0x40;
    local_1e8[0] = (allocator_type)((char)local_1e8[0] + '\x01');
  } while ((char)local_1e8[0] < '[');
  p_Var3 = (this->m_l2t)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var3 != local_38) {
    local_40 = this;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
      local_60 = (undefined1)p_Var3[1]._M_color;
      this_00 = std::__ostream_insert<char,std::char_traits<char>>(local_1d8,&local_60,1);
      std::__ostream_insert<char,std::char_traits<char>>(this_00," -> ",4);
      std::ostream::operator<<(this_00,*(int *)&p_Var3[1].field_0x4);
      __x = (double)std::__cxx11::stringbuf::str();
      debug::log(__x);
      if ((long *)CONCAT71(uStack_5f,local_60) != local_50) {
        operator_delete((long *)CONCAT71(uStack_5f,local_60),local_50[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
      std::ios_base::~ios_base(local_168);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != local_38);
  }
  return;
}

Assistant:

CTape(const int tape_lentgh = TAPE_LENGTH): m_tape(tape_lentgh)
        {
            m_l2t[' '] = 0;
            for (char i = 'A'; i <= 'Z'; ++i)
            {
                m_l2t[i] = i - 'A' + 1;
            }
            for (l2t_t::const_iterator i = m_l2t.begin(); i != m_l2t.end(); ++i)
            {
                std::stringstream ss;
                ss << i->first << " -> " << i->second;
                debug::log(ss.str());
            }
        }